

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyi_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::python::PyiGenerator::GetFieldType_abi_cxx11_
          (string *__return_storage_ptr__,PyiGenerator *this,FieldDescriptor *field_des,
          Descriptor *containing_des)

{
  ushort *puVar1;
  string *psVar2;
  bool bVar3;
  Descriptor *descriptor;
  EnumDescriptor *descriptor_00;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view filename;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  string module;
  LogMessage local_f0 [3];
  string local_c0;
  string local_a0;
  AlphaNum local_80;
  AlphaNum local_50;
  
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field_des->type_ * 4)) {
  case 1:
  case 2:
  case 3:
  case 4:
    __y._M_str = "int";
    break;
  case 5:
  case 6:
    __y._M_str = "float";
    break;
  case 7:
    __y._M_str = "bool";
    break;
  case 8:
    descriptor_00 = FieldDescriptor::enum_type(field_des);
    ModuleLevelName<google::protobuf::EnumDescriptor>(__return_storage_ptr__,this,descriptor_00);
    return __return_storage_ptr__;
  case 9:
    if (field_des->type_ == 9) {
      __y._M_str = "str";
    }
    else {
      __y._M_str = "bytes";
    }
    break;
  case 10:
    descriptor = FieldDescriptor::message_type(field_des);
    ModuleLevelName<google::protobuf::Descriptor>(__return_storage_ptr__,this,descriptor);
    if (containing_des->containing_type_ == (Descriptor *)0x0) {
      return __return_storage_ptr__;
    }
    puVar1 = (ushort *)(containing_des->all_names_).payload_;
    __y._M_len = (ulong)*puVar1;
    __y._M_str = (char *)((long)puVar1 + ~__y._M_len);
    __x._M_str = (__return_storage_ptr__->_M_dataplus)._M_p;
    __x._M_len = __return_storage_ptr__->_M_string_length;
    bVar3 = std::operator==(__x,__y);
    if (!bVar3) {
      return __return_storage_ptr__;
    }
    psVar2 = field_des->file_->name_;
    filename._M_str = __y._M_str;
    filename._M_len = (size_t)(psVar2->_M_dataplus)._M_p;
    ModuleName_abi_cxx11_(&local_c0,(python *)psVar2->_M_string_length,filename);
    local_f0[0]._0_8_ = local_c0._M_string_length;
    local_f0[0].data_._M_t.
    super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    ._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                    )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                      )local_c0._M_dataplus._M_p;
    local_50.piece_ = absl::lts_20250127::NullSafeStringView(".");
    local_80.piece_._M_str = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_80.piece_._M_len = __return_storage_ptr__->_M_string_length;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_a0,(lts_20250127 *)local_f0,&local_50,&local_80,&local_50);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    return __return_storage_ptr__;
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/python/pyi_generator.cc"
               ,0x18a);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (local_f0,(char (*) [24])"Unsupported field type.");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_f0)
    ;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__y._M_str,(allocator<char> *)local_f0);
  return __return_storage_ptr__;
}

Assistant:

std::string PyiGenerator::GetFieldType(
    const FieldDescriptor& field_des, const Descriptor& containing_des) const {
  switch (field_des.cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
    case FieldDescriptor::CPPTYPE_UINT32:
    case FieldDescriptor::CPPTYPE_INT64:
    case FieldDescriptor::CPPTYPE_UINT64:
      return "int";
    case FieldDescriptor::CPPTYPE_DOUBLE:
    case FieldDescriptor::CPPTYPE_FLOAT:
      return "float";
    case FieldDescriptor::CPPTYPE_BOOL:
      return "bool";
    case FieldDescriptor::CPPTYPE_ENUM:
      return ModuleLevelName(*field_des.enum_type());
    case FieldDescriptor::CPPTYPE_STRING:
      if (field_des.type() == FieldDescriptor::TYPE_STRING) {
        return "str";
      } else {
        return "bytes";
      }
    case FieldDescriptor::CPPTYPE_MESSAGE: {
      // If the field is inside a nested message and the nested message has the
      // same name as a top-level message, then we need to prefix the field type
      // with the module name for disambiguation.
      std::string name = ModuleLevelName(*field_des.message_type());
      if ((containing_des.containing_type() != nullptr &&
           name == containing_des.name())) {
        std::string module = ModuleName(field_des.file()->name());
        name = absl::StrCat(module, ".", name);
      }
      return name;
    }
    default:
      ABSL_LOG(FATAL) << "Unsupported field type.";
  }
  return "";
}